

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int JetHead::Socket::getInterfaceAddress(char *if_name,Address *addr)

{
  int __fd;
  int iVar1;
  ifreq ifr;
  char local_50 [15];
  undefined1 local_41;
  undefined2 local_40;
  undefined6 uStack_3e;
  undefined8 uStack_38;
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    jh_log_print(1,
                 "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x24e,"socket failed");
    iVar1 = -1;
  }
  else {
    strncpy(local_50,if_name,0x10);
    local_41 = 0;
    local_40 = 2;
    iVar1 = ioctl(__fd,0x8915,local_50);
    if (iVar1 == 0) {
      (addr->mAddr).sin_family = local_40;
      (addr->mAddr).sin_port = (short)uStack_3e;
      (addr->mAddr).sin_addr = (in_addr)(int)((uint6)uStack_3e >> 0x10);
      *(undefined8 *)(addr->mAddr).sin_zero = uStack_38;
      addr->mLen = 0x10;
    }
    else {
      jh_log_print(2,
                   "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x25b,"SIOCGIFADDR failed for %s",local_50);
    }
    ::close(__fd);
  }
  return iVar1;
}

Assistant:

int Socket::getInterfaceAddress( const char *if_name, Socket::Address& addr )
{
	struct ifreq ifr;
	int sockfd;

	sockfd = socket( PF_INET, SOCK_DGRAM, 0 );

	if ( sockfd < 0 )
	{
		LOG_ERR_FATAL( "socket failed" );
		return -1;
	}
	
	strncpy(ifr.ifr_name, if_name, IFNAMSIZ);
	ifr.ifr_name[IFNAMSIZ - 1] = 0;

	ifr.ifr_addr.sa_family = AF_INET;

	int res = ioctl(sockfd, SIOCGIFADDR, &ifr); 	

	if (res)
	{	
		LOG_WARN( "SIOCGIFADDR failed for %s", ifr.ifr_name );
		
		::close( sockfd );
		
		return res;
	}

	addr.setSockaddr( (struct sockaddr_in*) &(ifr.ifr_addr), 
					  sizeof(struct sockaddr_in) );
	
	LOG_INFO( "Lookup of %s got address %s", if_name, addr.getName() );
	
	::close( sockfd );
	
	return res;
}